

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeEventQueryKernelTimestampsExt
          (ze_event_handle_t hEvent,ze_device_handle_t hDevice,uint32_t *pCount,
          ze_event_query_kernel_timestamps_results_ext_properties_t *pResults)

{
  ze_pfnEventQueryKernelTimestampsExt_t pfnQueryKernelTimestampsExt;
  ze_result_t result;
  ze_event_query_kernel_timestamps_results_ext_properties_t *pResults_local;
  uint32_t *pCount_local;
  ze_device_handle_t hDevice_local;
  ze_event_handle_t hEvent_local;
  
  pfnQueryKernelTimestampsExt._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c608 != (code *)0x0) {
    pfnQueryKernelTimestampsExt._4_4_ = (*DAT_0011c608)(hEvent,hDevice,pCount,pResults);
  }
  return pfnQueryKernelTimestampsExt._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeEventQueryKernelTimestampsExt(
        ze_event_handle_t hEvent,                       ///< [in] handle of the event
        ze_device_handle_t hDevice,                     ///< [in] handle of the device to query
        uint32_t* pCount,                               ///< [in,out] pointer to the number of event packets available.
                                                        ///<    - This value is implementation specific.
                                                        ///<    - if `*pCount` is zero, then the driver shall update the value with
                                                        ///< the total number of event packets available.
                                                        ///<    - if `*pCount` is greater than the number of event packets
                                                        ///< available, the driver shall update the value with the correct value.
                                                        ///<    - Buffer(s) for query results must be sized by the application to
                                                        ///< accommodate a minimum of `*pCount` elements.
        ze_event_query_kernel_timestamps_results_ext_properties_t* pResults ///< [in,out][optional][range(0, *pCount)] pointer to event query
                                                        ///< properties structure(s).
                                                        ///<    - This parameter may be null when `*pCount` is zero.
                                                        ///<    - if `*pCount` is less than the number of event packets available,
                                                        ///< the driver may only update `*pCount` elements, starting at element zero.
                                                        ///<    - if `*pCount` is greater than the number of event packets
                                                        ///< available, the driver may only update the valid elements.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryKernelTimestampsExt = context.zeDdiTable.Event.pfnQueryKernelTimestampsExt;
        if( nullptr != pfnQueryKernelTimestampsExt )
        {
            result = pfnQueryKernelTimestampsExt( hEvent, hDevice, pCount, pResults );
        }
        else
        {
            // generic implementation
        }

        return result;
    }